

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O1

void __thiscall
AssemblyCode::MoveRegToMemByRegPlusConst::MoveRegToMemByRegPlusConst
          (MoveRegToMemByRegPlusConst *this,CTemp *target,int constant,CTemp *source)

{
  pointer pcVar1;
  
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00184f90;
  (this->target).name._M_dataplus._M_p = (pointer)&(this->target).name.field_2;
  pcVar1 = (target->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->target,pcVar1,pcVar1 + (target->name)._M_string_length);
  this->constant = constant;
  (this->source).name._M_dataplus._M_p = (pointer)&(this->source).name.field_2;
  pcVar1 = (source->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->source,pcVar1,pcVar1 + (source->name)._M_string_length);
  return;
}

Assistant:

AssemblyCode::MoveRegToMemByRegPlusConst::MoveRegToMemByRegPlusConst( const IRT::CTemp &target, int constant,
                                                                      const IRT::CTemp &source ) : target( target ),
                                                                                                   constant( constant ),
                                                                                                   source( source ) { }